

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpreadsheetMode.cpp
# Opt level: O1

void __thiscall KDReports::Test::testWithHeaders(Test *this)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  int iVar4;
  QFont *pQVar5;
  AutoTableElement *pAVar6;
  longlong __tmp;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  AutoTableElement tableElement;
  Report report;
  QArrayDataPointer<char16_t> local_98;
  QByteArrayView local_80;
  QArrayDataPointer<char16_t> local_70;
  Report local_50 [24];
  QArrayDataPointer<char16_t> local_38;
  char *local_20;
  
  fillModel(this,4,0x14,false);
  KDReports::Report::Report(local_50,(QObject *)0x0);
  KDReports::Report::setReportMode((ReportMode)local_50);
  local_98.d = (Data *)0x0;
  local_98.ptr = (char16_t *)0x0;
  local_98.size = 0;
  QByteArrayView::QByteArrayView<char,_true>((QByteArrayView *)&local_38,"Noto Sans",9);
  QVar7.m_data = (storage_type *)local_38.d;
  QVar7.m_size = (qsizetype)&local_70;
  QString::fromLatin1(QVar7);
  qVar3 = local_98.size;
  pcVar2 = local_98.ptr;
  pDVar1 = local_98.d;
  local_98.d = local_70.d;
  local_70.d = pDVar1;
  local_98.ptr = local_70.ptr;
  local_98.size = local_70.size;
  local_70.ptr = pcVar2;
  local_70.size = qVar3;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  QFont::QFont((QFont *)&local_80,(QString *)&local_98,8,-1,false);
  KDReports::Report::setDefaultFont((QFont *)local_50);
  QFont::~QFont((QFont *)&local_80);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
  pQVar5 = (QFont *)KDReports::Report::header(local_50,1);
  local_98.d = (Data *)0x0;
  local_98.ptr = (char16_t *)0x0;
  local_98.size = 0;
  QByteArrayView::QByteArrayView<char,_true>((QByteArrayView *)&local_38,"courier",7);
  QVar8.m_data = (storage_type *)local_38.d;
  QVar8.m_size = (qsizetype)&local_70;
  QString::fromLatin1(QVar8);
  qVar3 = local_98.size;
  pcVar2 = local_98.ptr;
  pDVar1 = local_98.d;
  local_98.d = local_70.d;
  local_70.d = pDVar1;
  local_98.ptr = local_70.ptr;
  local_98.size = local_70.size;
  local_70.ptr = pcVar2;
  local_70.size = qVar3;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  QFont::QFont((QFont *)&local_80,(QString *)&local_98,0x28,-1,false);
  KDReports::Header::setDefaultFont(pQVar5);
  QFont::~QFont((QFont *)&local_80);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
  local_20 = "This is the page header.\nIt\'s big.\nVery\nbig.\nHuge.";
  QByteArrayView::QByteArrayView<const_char_*,_true>(&local_80,&local_20);
  QVar9.m_data = (storage_type *)local_80.m_size;
  QVar9.m_size = (qsizetype)&local_70;
  QString::fromUtf8(QVar9);
  local_38.d = local_70.d;
  local_38.ptr = local_70.ptr;
  local_70.d = (Data *)0x0;
  local_70.ptr = (char16_t *)0x0;
  local_38.size = local_70.size;
  local_70.size = 0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  KDReports::TextElement::TextElement((TextElement *)&local_98,(QString *)&local_38);
  KDReports::Header::addElement(pQVar5,&local_98,1);
  KDReports::TextElement::~TextElement((TextElement *)&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  KDReports::AutoTableElement::AutoTableElement
            ((AutoTableElement *)&local_70,(QAbstractItemModel *)&this->m_model);
  KDReports::AutoTableElement::setVerticalHeaderVisible(SUB81(&local_70,0));
  KDReports::AbstractTableElement::setPadding(3.0);
  pAVar6 = (AutoTableElement *)KDReports::Report::mainTable();
  KDReports::MainTable::setAutoTableElement(pAVar6);
  iVar4 = KDReports::Report::numberOfPages();
  QTest::qCompare(iVar4,2,"report.numberOfPages()","2",
                  "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                  ,0x1c4);
  KDReports::AutoTableElement::~AutoTableElement((AutoTableElement *)&local_70);
  KDReports::Report::~Report(local_50);
  return;
}

Assistant:

void testWithHeaders()
    {
        fillModel(4, 20);
        Report report;
        report.setReportMode(Report::SpreadSheet);
        report.setDefaultFont(QFont(QLatin1String(s_fontName), 8));
        // A page header with a huge font
        KDReports::Header &header = report.header(KDReports::FirstPage);
        header.setDefaultFont(QFont(QLatin1String("courier"), 40));
        header.addElement(KDReports::TextElement("This is the page header.\nIt's big.\nVery\nbig.\nHuge."));
        AutoTableElement tableElement(&m_model);
        tableElement.setVerticalHeaderVisible(true);
        tableElement.setPadding(3);
        report.mainTable()->setAutoTableElement(tableElement);
        // report.exportToFile( "testWithHeaders.pdf" ); // for debugging
#ifndef Q_OS_MAC
        QCOMPARE(report.numberOfPages(), 2);
#endif
    }